

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_mprobe_(MPIABI_Fint *source,MPIABI_Fint *tag,MPIABI_Fint *comm,MPIABI_Fint *message,
                   MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  MPIABI_Fint *status_local;
  MPIABI_Fint *message_local;
  MPIABI_Fint *comm_local;
  MPIABI_Fint *tag_local;
  MPIABI_Fint *source_local;
  
  mpi_mprobe_(source,tag,comm,message,status,ierror);
  return;
}

Assistant:

void mpiabi_mprobe_(
  const MPIABI_Fint * source,
  const MPIABI_Fint * tag,
  const MPIABI_Fint * comm,
  MPIABI_Fint * message,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_mprobe_(
    source,
    tag,
    comm,
    message,
    status,
    ierror
  );
}